

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.cpp
# Opt level: O1

void __thiscall FIX::message_order::setOrder(message_order *this,int *order,int size)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  atomic<long> *counter;
  long *__s;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  shared_array<int> local_48;
  
  if (0 < size) {
    iVar3 = *order;
    this->m_delim = iVar3;
    this->m_largest = iVar3;
    if (size != 1) {
      uVar4 = 1;
      do {
        if (iVar3 <= order[uVar4]) {
          iVar3 = order[uVar4];
        }
        this->m_largest = iVar3;
        uVar4 = uVar4 + 1;
      } while ((uint)size != uVar4);
    }
    iVar3 = this->m_largest + 1;
    if (iVar3 == 0) {
      local_48.m_size = 0;
      local_48.m_buffer = (int *)0x0;
    }
    else {
      sVar6 = (size_t)iVar3;
      uVar4 = sVar6 * 4 + 0xc;
      __s = (long *)operator_new__(-(ulong)(sVar6 + 3 >> 0x3e != 0) | uVar4);
      memset(__s,0,uVar4);
      *__s = 1;
      local_48.m_size = sVar6;
      local_48.m_buffer = (int *)__s;
    }
    shared_array<int>::operator=(&this->m_groupOrder,&local_48);
    piVar2 = local_48.m_buffer;
    if ((long *)local_48.m_buffer != (long *)0x0) {
      LOCK();
      *(long *)local_48.m_buffer = *(long *)local_48.m_buffer + -1;
      UNLOCK();
      if (*(long *)local_48.m_buffer == 0) {
        local_48.m_size = 0;
        local_48.m_buffer = (int *)0x0;
        if ((long *)piVar2 != (long *)0x0) {
          operator_delete__(piVar2);
        }
      }
    }
    piVar2 = (this->m_groupOrder).m_buffer;
    uVar4 = 1;
    if (1 < size) {
      uVar4 = (ulong)(uint)size;
    }
    uVar5 = 0;
    do {
      piVar1 = order + uVar5;
      uVar5 = uVar5 + 1;
      piVar2[(long)*piVar1 + 3] = (int)uVar5;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void message_order::setOrder(const int order[], int size) {
  if (size < 1) {
    return;
  }
  m_largest = m_delim = order[0];

  // collect all fields and find the largest field number
  for (int i = 1; i < size; ++i) {
    int field = order[i];
    m_largest = m_largest > field ? m_largest : field;
  }

  m_groupOrder = shared_array<int>::create(m_largest + 1);
  for (int i = 0; i < size; ++i) {
    m_groupOrder[order[i]] = i + 1;
  }
}